

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

bool units::cleanUnitString(string *unit_string,uint64_t match_flags)

{
  byte *pbVar1;
  byte *pbVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_type sVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  _Alloc_hider __nptr;
  bool bVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  size_t sVar12;
  ulong uVar13;
  ulong uVar14;
  string *ustring;
  uint *puVar15;
  undefined8 uVar16;
  const_iterator cVar17;
  size_t sVar18;
  pointer pcVar19;
  pointer pcVar20;
  char cVar21;
  char cVar22;
  char *pcVar23;
  char extraout_DL;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  byte *pbVar24;
  string *psVar25;
  char *pcVar26;
  long lVar27;
  size_t sz;
  char cVar28;
  bool bVar29;
  char *pcVar30;
  byte *pbVar31;
  char cVar32;
  long lVar33;
  size_t *in_R9;
  pointer pcVar34;
  byte bVar35;
  byte bVar36;
  int iVar37;
  ulong uVar38;
  size_type sVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  double dVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  precise_unit pVar48;
  precise_unit pVar49;
  size_t reploc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  bool local_5a9;
  uint local_598;
  ulong local_590;
  undefined1 local_582;
  undefined1 local_581;
  char *local_580;
  size_type local_578;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_570 [4];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_470;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_430;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_370;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_330;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_270;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_230;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_130;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  
  local_578 = unit_string->_M_string_length;
  ustring = unit_string;
  if (cleanUnitString(std::__cxx11::string&,unsigned_long)::spchar_abi_cxx11_ == '\0')
  goto LAB_00183598;
LAB_001815e2:
  bVar7 = false;
  uVar8 = (byte)(ustring->_M_dataplus)._M_p[ustring->_M_string_length - 1] - 0x2a;
  if ((uVar8 < 0x35) && ((0x10000000000021U >> ((ulong)uVar8 & 0x3f) & 1) != 0)) {
    std::__cxx11::string::pop_back();
    bVar7 = true;
  }
  uVar11 = std::__cxx11::string::find_first_not_of
                     ((char *)ustring,
                      (ulong)cleanUnitString(std::__cxx11::string&,unsigned_long)::spchar_abi_cxx11_
                             ._M_dataplus._M_p,0);
  if (uVar11 != 0) {
    if (uVar11 == 0xffffffffffffffff) {
      ustring->_M_string_length = 0;
      *(ustring->_M_dataplus)._M_p = '\0';
      return true;
    }
    std::__cxx11::string::erase((ulong)ustring,0);
    uVar11 = std::__cxx11::string::find_first_not_of
                       ((char *)ustring,
                        (ulong)cleanUnitString(std::__cxx11::string&,unsigned_long)::
                               spchar_abi_cxx11_._M_dataplus._M_p,0);
    bVar7 = true;
  }
  local_5a9 = (ustring->_M_dataplus)._M_p[uVar11] == '/';
  if (local_5a9) {
    std::__cxx11::string::insert((ulong)ustring,uVar11,'\x01');
    bVar7 = true;
  }
  cVar32 = (char)unit_string;
  if ((match_flags >> 0x24 & 1) != 0) {
    local_590 = std::__cxx11::string::find((char *)ustring,0x19f746,0);
    goto LAB_00182836;
  }
  pcVar23 = (ustring->_M_dataplus)._M_p;
  uVar11 = ustring->_M_string_length;
  pcVar26 = pcVar23 + uVar11;
  pcVar30 = pcVar23;
  if (0 < (long)uVar11 >> 2) {
    pcVar30 = pcVar23 + (uVar11 & 0xfffffffffffffffc);
    lVar33 = ((long)uVar11 >> 2) + 1;
    pcVar23 = pcVar23 + 3;
    do {
      if (pcVar23[-3] < '\0') {
        pcVar23 = pcVar23 + -3;
        goto LAB_0018175e;
      }
      if (pcVar23[-2] < '\0') {
        pcVar23 = pcVar23 + -2;
        goto LAB_0018175e;
      }
      if (pcVar23[-1] < '\0') {
        pcVar23 = pcVar23 + -1;
        goto LAB_0018175e;
      }
      if (*pcVar23 < '\0') goto LAB_0018175e;
      lVar33 = lVar33 + -1;
      pcVar23 = pcVar23 + 4;
    } while (1 < lVar33);
  }
  lVar33 = (long)pcVar26 - (long)pcVar30;
  if (lVar33 == 1) {
LAB_00181723:
    pcVar23 = pcVar30;
    if (-1 < *pcVar30) {
      pcVar23 = pcVar26;
    }
  }
  else if (lVar33 == 2) {
LAB_0018171b:
    pcVar23 = pcVar30;
    if (-1 < *pcVar30) {
      pcVar30 = pcVar30 + 1;
      goto LAB_00181723;
    }
  }
  else {
    pcVar23 = pcVar26;
    if ((lVar33 == 3) && (pcVar23 = pcVar30, -1 < *pcVar30)) {
      pcVar30 = pcVar30 + 1;
      goto LAB_0018171b;
    }
  }
LAB_0018175e:
  bVar29 = bVar7;
  if (pcVar23 != pcVar26) {
    bVar41 = false;
    lVar33 = 0;
    do {
      pcVar26 = *(char **)((long)&unicodeReplacement(std::__cxx11::string&)::ucodeReplacements +
                          lVar33);
      strlen(pcVar26);
      for (uVar11 = std::__cxx11::string::find((char *)unit_string,(ulong)pcVar26,0);
          uVar11 != 0xffffffffffffffff;
          uVar11 = std::__cxx11::string::find((char *)unit_string,(ulong)pcVar26,uVar11)) {
        pcVar23 = (char *)strlen(pcVar26);
        if ((uVar11 == 0 || pcVar23 != (char *)0x1) ||
           ((byte)(unit_string->_M_dataplus)._M_p[uVar11 - 1] < 0xc1)) {
          pcVar30 = *(char **)((long)&DAT_001d1230 + lVar33);
          strlen(pcVar30);
          std::__cxx11::string::replace((ulong)unit_string,uVar11,pcVar23,(ulong)pcVar30);
          if (uVar11 == 0) {
            uVar11 = 0;
          }
          else if ((unit_string->_M_dataplus)._M_p[uVar11 - 1] == '\\') {
            uVar11 = uVar11 - 1;
            std::__cxx11::string::erase((ulong)unit_string,uVar11);
          }
          sVar12 = strlen(pcVar30);
          uVar11 = sVar12 + uVar11;
          bVar41 = true;
        }
        else {
          uVar11 = uVar11 + 1;
        }
        strlen(pcVar26);
      }
      lVar33 = lVar33 + 0x10;
    } while (lVar33 != 0x420);
    bVar29 = true;
    if (!bVar41) {
      bVar29 = bVar7;
    }
  }
  lVar33 = 0;
  do {
    pcVar26 = *(char **)((long)&cleanUnitString::earlyCodeReplacements._M_elems[0].first + lVar33);
    strlen(pcVar26);
    uVar11 = std::__cxx11::string::find((char *)unit_string,(ulong)pcVar26,0);
    if (uVar11 != 0xffffffffffffffff) {
      pcVar23 = *(char **)((long)&cleanUnitString::earlyCodeReplacements._M_elems[0].second + lVar33
                          );
      do {
        pcVar30 = (char *)strlen(pcVar26);
        strlen(pcVar23);
        std::__cxx11::string::replace((ulong)unit_string,uVar11,pcVar30,(ulong)pcVar23);
        strlen(pcVar26);
        uVar11 = std::__cxx11::string::find((char *)unit_string,(ulong)pcVar26,uVar11 + 1);
      } while (uVar11 != 0xffffffffffffffff);
      bVar29 = true;
    }
    lVar33 = lVar33 + 0x10;
  } while (lVar33 != 0x40);
  lVar33 = std::__cxx11::string::find_first_of
                     ((char *)unit_string,
                      (ulong)cleanUnitString(std::__cxx11::string&,unsigned_long)::spchar_abi_cxx11_
                             ._M_dataplus._M_p,0);
  if (lVar33 != -1) {
    local_580 = (char *)0x0;
    iVar9 = std::__cxx11::string::compare((ulong)unit_string,0,(char *)0x4);
    if (iVar9 == 0) {
      local_580 = (char *)0x2;
      std::__cxx11::string::replace((ulong)unit_string,0,(char *)0x4,0x19aa7c);
    }
    local_5a9 = iVar9 == 0 || local_5a9;
    bVar7 = ReplaceStringInPlace(unit_string," per ",5,"/",(int)&local_580,in_R9);
    if ((local_580 != (char *)0x0) &&
       (uVar11 = std::__cxx11::string::find(cVar32,0x28), uVar11 != 0xffffffffffffffff)) {
      uVar13 = std::__cxx11::string::find(cVar32,0x2f);
      do {
        uVar38 = uVar13 + 1;
        uVar14 = std::__cxx11::string::find(cVar32,0x2f);
        uVar13 = uVar14;
        if (uVar11 < uVar14) {
          if (uVar14 == 0xffffffffffffffff) {
            std::__cxx11::string::push_back(cVar32);
          }
          else {
            std::__cxx11::string::insert((ulong)unit_string,uVar14,'\x01');
          }
          std::__cxx11::string::insert((ulong)unit_string,uVar38,'\x01');
          uVar13 = uVar14 + 2;
        }
      } while (uVar14 != 0xffffffffffffffff);
    }
    lVar33 = std::__cxx11::string::find_first_not_of((char *)unit_string,0x19a42b,0);
    lVar33 = std::__cxx11::string::find_first_of((char *)unit_string,0x19a42b,lVar33 + 1);
    auVar45 = std::__cxx11::string::find_first_of((char *)unit_string,0x19f8c1,0);
    auVar47._8_8_ = auVar45._8_8_;
    auVar47._0_8_ = lVar33;
    if ((lVar33 == 2) && (auVar47._0_8_ = 2, 4 < unit_string->_M_string_length)) {
      auVar46 = std::__cxx11::string::find_first_not_of((char *)unit_string,0x19a42b,2);
      uVar16 = auVar46._8_8_;
      auVar6._8_8_ = uVar16;
      auVar6._0_8_ = 2;
      auVar5._8_8_ = uVar16;
      auVar5._0_8_ = 2;
      auVar47._8_8_ = uVar16;
      auVar47._0_8_ = 2;
      if ((auVar46._0_8_ != -1) &&
         ((auVar47 = auVar5, auVar45._0_8_ == -1 &&
          (auVar47 = auVar6, (unit_string->_M_dataplus)._M_p[auVar46._0_8_] != '(')))) {
        std::__cxx11::string::substr((ulong)local_570,(ulong)unit_string);
        iVar9 = std::__cxx11::string::compare((char *)local_570);
        auVar47._8_8_ = extraout_RDX;
        auVar47._0_8_ = 2;
        if (iVar9 != 0) {
          pVar48 = get_unit(&local_570[0].first,match_flags);
          auVar47._8_8_ = extraout_RDX_00;
          auVar47._0_8_ = 2;
          if (pVar48.base_units_ != (unit_data)0xfa94a488 || !NAN(pVar48.multiplier_)) {
            (unit_string->_M_dataplus)._M_p[2] = '_';
            pVar48 = get_unit(unit_string,match_flags);
            if (pVar48.base_units_ == (unit_data)0xfa94a488 && NAN(pVar48.multiplier_)) {
              (unit_string->_M_dataplus)._M_p[2] = '*';
            }
            auVar47 = std::__cxx11::string::find_first_of((char *)unit_string,0x19a42b,3);
          }
        }
        uVar16 = auVar47._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_570[0].first._M_dataplus._M_p != &local_570[0].first.field_2) {
          operator_delete(local_570[0].first._M_dataplus._M_p,
                          local_570[0].first.field_2._M_allocated_capacity + 1);
          auVar47._8_8_ = extraout_RDX_01;
          auVar47._0_8_ = uVar16;
        }
      }
    }
    if (auVar47._0_8_ != -1) {
      paVar3 = &local_570[0].first.field_2;
      do {
        lVar33 = auVar47._0_8_;
        cVar21 = auVar47[8];
        if (lVar33 + 2U == unit_string->_M_string_length) {
          if (auVar45._0_8_ == -1) {
            std::__cxx11::string::substr((ulong)local_570,(ulong)unit_string);
            pVar48 = get_unit(&local_570[0].first,match_flags);
            bVar41 = pVar48.base_units_ != (unit_data)0xfa94a488;
            if (bVar41 || !NAN(pVar48.multiplier_)) {
              (unit_string->_M_dataplus)._M_p[lVar33] = '_';
              pVar49 = get_unit(unit_string,match_flags);
              if (pVar49.base_units_ == (unit_data)0xfa94a488 && NAN(pVar49.multiplier_)) {
                (unit_string->_M_dataplus)._M_p[lVar33] = '*';
              }
            }
            cVar21 = -0x78;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_570[0].first._M_dataplus._M_p != paVar3) {
              operator_delete(local_570[0].first._M_dataplus._M_p,
                              local_570[0].first.field_2._M_allocated_capacity + 1);
              cVar21 = extraout_DL;
            }
            if (bVar41 || !NAN(pVar48.multiplier_)) break;
          }
          shortStringReplacement_abi_cxx11_
                    (&local_570[0].first,
                     (units *)(ulong)(uint)(int)(unit_string->_M_dataplus)._M_p[lVar33 + 1],cVar21);
          std::__cxx11::string::replace
                    ((ulong)unit_string,lVar33 + 1,(char *)0x1,
                     (ulong)local_570[0].first._M_dataplus._M_p);
LAB_00181d19:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_570[0].first._M_dataplus._M_p != paVar3) {
            operator_delete(local_570[0].first._M_dataplus._M_p,
                            local_570[0].first.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          pcVar19 = (unit_string->_M_dataplus)._M_p;
          uVar8 = (byte)pcVar19[lVar33 + 1] - 0x20;
          if ((uVar8 < 0x3f) && ((0x400000000000c401U >> ((ulong)uVar8 & 0x3f) & 1) != 0)) {
            shortStringReplacement_abi_cxx11_
                      (&local_570[0].first,(units *)(ulong)(uint)(int)pcVar19[lVar33 + 1U],'\x01');
            std::__cxx11::string::replace
                      ((ulong)unit_string,lVar33 + 1U,(char *)0x1,
                       (ulong)local_570[0].first._M_dataplus._M_p);
            goto LAB_00181d19;
          }
        }
        auVar47 = std::__cxx11::string::find_first_of((char *)unit_string,0x19a42b,lVar33 + 1);
      } while (auVar47._0_8_ != -1);
    }
    local_5a9 = local_5a9 || bVar7;
    uVar11 = std::__cxx11::string::find((char *)unit_string,0x199142,0);
    local_590 = 0xffffffffffffffff;
    do {
      if (uVar11 == 0xffffffffffffffff) break;
      lVar33 = std::__cxx11::string::find_first_not_of
                         ((char *)unit_string,
                          (ulong)cleanUnitString(std::__cxx11::string&,unsigned_long)::
                                 spchar_abi_cxx11_._M_dataplus._M_p,uVar11 + 4);
      if (lVar33 == -1) {
LAB_00181dc6:
        uVar11 = std::__cxx11::string::find((char *)unit_string,0x199142,uVar11 + 3);
        bVar7 = true;
        uVar13 = local_590;
      }
      else {
        cVar21 = (unit_string->_M_dataplus)._M_p[lVar33];
        bVar7 = false;
        uVar13 = uVar11;
        if ((cVar21 != '(') && (cVar21 != '[')) goto LAB_00181dc6;
      }
      local_590 = uVar13;
    } while (bVar7);
    if ((cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_ == '\0') &&
       (iVar9 = __cxa_guard_acquire(&cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_)
       , iVar9 != 0)) {
      paVar3 = &local_570[0].first.field_2;
      local_570[0].first._M_string_length = 4;
      local_570[0].first.field_2._0_5_ = 0xd0a0920;
      local_570[0].first._M_dataplus._M_p = (pointer)paVar3;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_,
                     &local_570[0].first,'\0');
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_570[0].first._M_dataplus._M_p != paVar3) {
        operator_delete(local_570[0].first._M_dataplus._M_p,
                        local_570[0].first.field_2._M_allocated_capacity + 1);
      }
      __cxa_atexit(std::__cxx11::string::~string,
                   &cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_);
    }
    paVar3 = &local_570[0].first.field_2;
    local_570[0].first._M_string_length = 7;
    local_570[0].first.field_2._M_allocated_capacity = 0x20657261757173;
    local_570[0].first._M_dataplus._M_p = (pointer)paVar3;
    bVar7 = isolatePriorModifier(unit_string,&local_570[0].first,'d','D');
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_570[0].first._M_dataplus._M_p != paVar3) {
      operator_delete(local_570[0].first._M_dataplus._M_p,
                      local_570[0].first.field_2._M_allocated_capacity + 1);
    }
    local_570[0].first._M_string_length = 6;
    local_570[0].first.field_2._0_7_ = 0x206369627563;
    local_570[0].first._M_dataplus._M_p = (pointer)paVar3;
    bVar41 = isolatePriorModifier(unit_string,&local_570[0].first,'_','-');
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_570[0].first._M_dataplus._M_p != paVar3) {
      operator_delete(local_570[0].first._M_dataplus._M_p,
                      local_570[0].first.field_2._M_allocated_capacity + 1);
    }
    local_570[0].first.field_2._M_allocated_capacity = 0x6465726175717320;
    local_570[0].first._M_string_length = 8;
    local_570[0].first.field_2._M_local_buf[8] = '\0';
    bVar40 = false;
    local_570[0].first._M_dataplus._M_p = (pointer)paVar3;
    uVar11 = std::__cxx11::string::find((char *)unit_string,(ulong)paVar3,0);
    if (uVar11 != 0xffffffffffffffff) {
      uVar13 = std::__cxx11::string::find_last_not_of(cVar32,0x20);
      uVar13 = std::__cxx11::string::find_last_of((char *)unit_string,0x19f8c0,uVar13);
      bVar42 = true;
      if ((uVar13 != 0) && (uVar13 < unit_string->_M_string_length)) {
        bVar42 = (unit_string->_M_dataplus)._M_p[uVar13] != ' ';
      }
      if (!bVar42) {
        pcVar19 = (unit_string->_M_dataplus)._M_p;
        cVar21 = pcVar19[uVar13 + 1];
        bVar43 = true;
        bVar40 = true;
        if ((cVar21 != '*') && (cVar21 != '/')) {
          bVar40 = pcVar19[uVar13 - 1] == '/' || pcVar19[uVar13 - 1] == '*';
        }
        bVar35 = (cVar21 == '*' || cVar21 == '/') | bVar40;
        bVar35 = cVar21 == ')' | bVar35 | bVar35;
        bVar40 = (bool)(cVar21 == '-' | bVar35 | bVar35);
        if (!bVar40) {
          bVar43 = pcVar19[uVar13 - 1] == ')';
        }
        bVar43 = (bool)(bVar43 | bVar40);
        bVar42 = true;
        if (!bVar43) {
          bVar42 = pcVar19[uVar13 - 1] == '-';
        }
        bVar42 = (bool)(bVar42 | bVar43);
      }
      if (bVar42) {
        bVar40 = false;
      }
      else {
        uVar14 = std::__cxx11::string::rfind(cVar32,0x2f);
        bVar40 = uVar14 < uVar11;
        if (bVar40) {
          std::__cxx11::string::insert((ulong)unit_string,uVar14 + 1,'\x01');
          uVar11 = std::__cxx11::string::find(cVar32,0x2f);
          if (uVar11 == 0xffffffffffffffff) {
            std::__cxx11::string::push_back(cVar32);
          }
          else {
            std::__cxx11::string::insert((ulong)unit_string,uVar11,'\x01');
          }
          uVar13 = uVar13 + 1;
          bVar42 = uVar11 < uVar13;
          bVar40 = true;
        }
      }
      if (!bVar42) {
        (unit_string->_M_dataplus)._M_p[uVar13] = '*';
        bVar40 = true;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_570[0].first._M_dataplus._M_p != paVar3) {
      operator_delete(local_570[0].first._M_dataplus._M_p,
                      local_570[0].first.field_2._M_allocated_capacity + 1);
    }
    bVar35 = (bVar7 || bVar41) | bVar40;
    ustring = (string *)0x0;
LAB_001820b7:
    ustring = (string *)
              std::__cxx11::string::find_first_of
                        ((char *)unit_string,
                         cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_,
                         (ulong)ustring);
    while( true ) {
      bVar36 = bVar35;
      if (ustring == (string *)0xffffffffffffffff) goto LAB_001825aa;
      if ((ustring == (string *)0x0) || (local_5a9)) goto LAB_00182562;
      uVar11 = std::__cxx11::string::find_first_not_of
                         ((char *)unit_string,
                          cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_,
                          (ulong)ustring);
      if (uVar11 == 0xffffffffffffffff) break;
      if (ustring == (string *)0x1) {
        pcVar19 = (unit_string->_M_dataplus)._M_p;
        uVar8 = (byte)pcVar19[uVar11] - 0x2a;
        if ((uVar8 < 0x35) && ((0x10000000400021U >> ((ulong)uVar8 & 0x3f) & 1) != 0)) {
          std::__cxx11::string::erase((ulong)unit_string,1);
          ustring = (string *)0x1;
          goto LAB_00182294;
        }
        if (7 < unit_string->_M_string_length) {
          lVar33 = std::__cxx11::string::find(cVar32,0x2a);
          ustring = (string *)0x1;
          if (lVar33 == -1) {
            uVar13 = std::__cxx11::string::find_first_of((char *)unit_string,0x19f42f,uVar11);
            if (uVar13 < 9) {
              (unit_string->_M_dataplus)._M_p[1] = '*';
              ustring = (string *)
                        std::__cxx11::string::find_first_of
                                  ((char *)unit_string,
                                   cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_,1)
              ;
              local_5a9 = true;
              iVar9 = 2;
              goto LAB_001822a2;
            }
            ustring = (string *)0x1;
          }
          goto LAB_00182237;
        }
        pcVar19[1] = '*';
        ustring = (string *)0x1;
LAB_0018254b:
        ustring = (string *)
                  std::__cxx11::string::find_first_of
                            ((char *)unit_string,
                             cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_,
                             (ulong)ustring);
        local_5a9 = true;
LAB_0018229c:
        iVar9 = 2;
      }
      else {
LAB_00182237:
        pbVar2 = (byte *)(unit_string->_M_dataplus)._M_p;
        cVar21 = (ustring[-1].field_2._M_local_buf + 0xf)[(long)pbVar2];
        if (cVar21 == '/') {
LAB_00182253:
          std::__cxx11::string::erase((ulong)unit_string,(ulong)ustring);
LAB_00182294:
          ustring = (string *)
                    std::__cxx11::string::find_first_of
                              ((char *)unit_string,
                               cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_,
                               (ulong)ustring);
          goto LAB_0018229c;
        }
        if (cVar21 == '.') {
          ustring = (string *)((long)&(ustring->_M_dataplus)._M_p + 1);
          goto LAB_00182294;
        }
        if ((cVar21 == '*') ||
           ((uVar11 < unit_string->_M_string_length &&
            ((pbVar2[uVar11] == 0x2f || (pbVar2[uVar11] == 0x2a)))))) goto LAB_00182253;
        pbVar1 = pbVar2 + (long)ustring;
        pbVar24 = pbVar2;
        if (0 < (long)ustring >> 2) {
          pbVar24 = pbVar2 + ((ulong)ustring & 0xfffffffffffffffc);
          lVar33 = ((long)ustring >> 2) + 1;
          pbVar31 = pbVar2 + 3;
          do {
            bVar35 = pbVar31[-3];
            in_R9 = (size_t *)(ulong)(bVar35 - 0x30);
            if ((9 < (byte)(bVar35 - 0x30)) &&
               ((0x2f < bVar35 || ((0xec0000000000U >> ((ulong)(uint)bVar35 & 0x3f) & 1) == 0)))) {
              pbVar31 = pbVar31 + -3;
              goto LAB_00182441;
            }
            bVar35 = pbVar31[-2];
            in_R9 = (size_t *)(ulong)(bVar35 - 0x30);
            if ((9 < (byte)(bVar35 - 0x30)) &&
               ((0x2f < bVar35 || ((0xec0000000000U >> ((ulong)(uint)bVar35 & 0x3f) & 1) == 0)))) {
              pbVar31 = pbVar31 + -2;
              goto LAB_00182441;
            }
            bVar35 = pbVar31[-1];
            in_R9 = (size_t *)(ulong)(bVar35 - 0x30);
            if ((9 < (byte)(bVar35 - 0x30)) &&
               ((0x2f < bVar35 || ((0xec0000000000U >> ((ulong)(uint)bVar35 & 0x3f) & 1) == 0)))) {
              pbVar31 = pbVar31 + -1;
              goto LAB_00182441;
            }
            bVar35 = *pbVar31;
            in_R9 = (size_t *)(ulong)(bVar35 - 0x30);
            if ((9 < (byte)(bVar35 - 0x30)) &&
               ((0x2f < bVar35 || ((0xec0000000000U >> ((ulong)(uint)bVar35 & 0x3f) & 1) == 0))))
            goto LAB_00182441;
            lVar33 = lVar33 + -1;
            pbVar31 = pbVar31 + 4;
          } while (1 < lVar33);
        }
        lVar33 = (long)pbVar1 - (long)pbVar24;
        if (lVar33 == 1) {
LAB_001823f5:
          bVar35 = *pbVar24;
          pbVar31 = pbVar1;
          if ((9 < (byte)(bVar35 - 0x30)) &&
             ((0x2e < bVar35 || ((0x680000000000U >> ((ulong)(uint)bVar35 & 0x3f) & 1) == 0)))) {
            if (bVar35 == 0x2f) {
              pbVar24 = pbVar1;
            }
            pbVar31 = pbVar24;
            if (bVar35 == 0x2a) {
              pbVar31 = pbVar1;
            }
          }
        }
        else if (lVar33 == 2) {
LAB_001823d9:
          bVar35 = *pbVar24;
          if (((byte)(bVar35 - 0x30) < 10) ||
             ((pbVar31 = pbVar24, bVar35 < 0x30 &&
              ((0xec0000000000U >> ((ulong)(uint)bVar35 & 0x3f) & 1) != 0)))) {
            pbVar24 = pbVar24 + 1;
            goto LAB_001823f5;
          }
        }
        else {
          pbVar31 = pbVar1;
          if ((lVar33 == 3) &&
             ((bVar35 = *pbVar24, (byte)(bVar35 - 0x30) < 10 ||
              ((pbVar31 = pbVar24, bVar35 < 0x30 &&
               ((0xec0000000000U >> ((ulong)(uint)bVar35 & 0x3f) & 1) != 0)))))) {
            pbVar24 = pbVar24 + 1;
            goto LAB_001823d9;
          }
        }
LAB_00182441:
        if (pbVar31 == pbVar1) {
          *pbVar1 = 0x2a;
          goto LAB_0018254b;
        }
        iVar9 = 0;
        iVar37 = 0;
        if (ustring != (string *)0x0) {
          psVar25 = (string *)0x0;
          lVar33 = 0;
          do {
            lVar33 = lVar33 + (ulong)(pbVar2[(long)psVar25] == 0x2f);
            psVar25 = (string *)((long)&(psVar25->_M_dataplus)._M_p + 1);
          } while (ustring != psVar25);
          if (((lVar33 == 1) &&
              (lVar33 = std::__cxx11::string::rfind((char *)unit_string,0x19f8ae,(ulong)ustring),
              lVar33 == -1)) &&
             (lVar33 = std::__cxx11::string::rfind((char *)unit_string,0x19f8b2,(ulong)ustring),
             iVar9 = iVar37, lVar33 == -1)) {
            lVar33 = std::__cxx11::string::find_first_not_of
                               ((char *)unit_string,
                                cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_,
                                (ulong)ustring);
            lVar27 = std::__cxx11::string::find_first_of
                               ((char *)unit_string,0x19f8b6,(ulong)ustring);
            if (((lVar33 != -1) && (lVar27 != lVar33)) &&
               (pcVar19 = (unit_string->_M_dataplus)._M_p,
               9 < (byte)((pcVar19 + -1)[(long)ustring] - 0x30U))) {
              pcVar19[(long)&(ustring->_M_dataplus)._M_p] = '*';
              goto LAB_0018254b;
            }
          }
        }
      }
LAB_001822a2:
      bVar36 = 1;
      bVar35 = 1;
      if (iVar9 != 2) goto LAB_0018255d;
    }
    if (ustring <= (string *)unit_string->_M_string_length) {
      unit_string->_M_string_length = (size_type)ustring;
      (unit_string->_M_dataplus)._M_p[(long)&(ustring->_M_dataplus)._M_p] = '\0';
      iVar9 = 1;
      goto LAB_001822a2;
    }
    std::__throw_out_of_range_fmt
              ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",
               ustring);
LAB_00183598:
    iVar9 = __cxa_guard_acquire(&cleanUnitString(std::__cxx11::string&,unsigned_long)::
                                 spchar_abi_cxx11_);
    if (iVar9 != 0) {
      paVar3 = &local_570[0].first.field_2;
      local_570[0].first._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_570," \t\n\r","");
      std::operator+(&cleanUnitString(std::__cxx11::string&,unsigned_long)::spchar_abi_cxx11_,
                     &local_570[0].first,'\0');
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_570[0].first._M_dataplus._M_p != paVar3) {
        operator_delete(local_570[0].first._M_dataplus._M_p,
                        local_570[0].first.field_2._M_allocated_capacity + 1);
      }
      __cxa_atexit(std::__cxx11::string::~string,
                   &cleanUnitString(std::__cxx11::string&,unsigned_long)::spchar_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&cleanUnitString(std::__cxx11::string&,unsigned_long)::spchar_abi_cxx11_);
      ustring = unit_string;
    }
    goto LAB_001815e2;
  }
  local_590 = 0xffffffffffffffff;
  bVar7 = bVar29;
LAB_001825c6:
  uVar11 = std::__cxx11::string::find((char *)unit_string,0x19f8c4,0);
  while (ustring = unit_string, uVar11 != 0xffffffffffffffff) {
    uVar13 = uVar11 + 3;
    if (uVar13 < unit_string->_M_string_length) {
      pcVar19 = (unit_string->_M_dataplus)._M_p;
      bVar35 = pcVar19[uVar13];
      if ((((byte)(bVar35 - 0x30) < 10) ||
          ((bVar35 < 0x2f && ((0x680000000000U >> ((ulong)(uint)bVar35 & 0x3f) & 1) != 0)))) &&
         (((uVar11 == 0 ||
           ((bVar35 = pcVar19[uVar11 - 1], 9 < (byte)(bVar35 - 0x30) &&
            ((0x3a < bVar35 - 0x2b ||
             ((0x40000000400000dU >> ((ulong)(bVar35 - 0x2b) & 0x3f) & 1) == 0)))))) ||
          ((uVar11 != 1 && ((bVar35 == 0x2e && ((byte)(pcVar19[uVar11 - 2] - 0x3aU) < 0xf6)))))))) {
        std::__cxx11::string::substr((ulong)local_570,(ulong)unit_string);
        __nptr._M_p = local_570[0].first._M_dataplus._M_p;
        if ((local_570[0].first._M_string_length != 0) &&
           (uVar14 = (ulong)((*local_570[0].first._M_dataplus._M_p - 0x2bU & 0xfd) == 0),
           (byte)(local_570[0].first._M_dataplus._M_p[uVar14] - 0x30U) < 10)) {
          uVar14 = uVar14 + 1;
          do {
            if (local_570[0].first._M_string_length <= uVar14) goto LAB_0018271d;
            pbVar2 = (byte *)(local_570[0].first._M_dataplus._M_p + uVar14);
            uVar14 = uVar14 + 1;
          } while ((byte)(*pbVar2 - 0x30) < 10);
          uVar8 = *pbVar2 - 0x2e;
          if ((((0x37 < uVar8) || ((0x80000000800001U >> ((ulong)uVar8 & 0x3f) & 1) == 0)) ||
              (local_570[0].first._M_string_length <= uVar14)) ||
             ((9 < (byte)(local_570[0].first._M_dataplus._M_p[uVar14] - 0x30U) &&
              ((local_570[0].first._M_dataplus._M_p[uVar14] - 0x2bU & 0xfd) != 0)))) {
LAB_0018271d:
            puVar15 = (uint *)__errno_location();
            uVar8 = *puVar15;
            *puVar15 = 0;
            lVar33 = strtol(__nptr._M_p,&local_580,10);
            if (local_580 == __nptr._M_p) {
              uVar16 = std::__throw_invalid_argument("stoi");
LAB_001839b4:
              if (local_570[0].first._M_dataplus._M_p != (pointer)(ulong)uVar8) {
                operator_delete(local_570[0].first._M_dataplus._M_p,
                                local_570[0].first.field_2._M_allocated_capacity + 1);
              }
              __cxa_guard_abort(&cleanSpaces(std::__cxx11::string&,bool)::spaceChars_abi_cxx11_);
              _Unwind_Resume(uVar16);
            }
            uVar10 = (uint)lVar33;
            if (((int)uVar10 != lVar33) || (*puVar15 == 0x22)) {
              uVar16 = std::__throw_out_of_range("stoi");
              goto LAB_001839b4;
            }
            if (*puVar15 == 0) {
              *puVar15 = uVar8;
            }
            uVar8 = -uVar10;
            if (0 < (int)uVar10) {
              uVar8 = uVar10;
            }
            if (uVar8 < 0x27) {
              std::__cxx11::string::replace((ulong)unit_string,uVar11,(char *)0x3,0x19f627);
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_570[0].first._M_dataplus._M_p != &local_570[0].first.field_2) {
          operator_delete(local_570[0].first._M_dataplus._M_p,
                          local_570[0].first.field_2._M_allocated_capacity + 1);
        }
      }
    }
    uVar11 = std::__cxx11::string::find((char *)unit_string,0x19f8c4,uVar13);
  }
LAB_00182836:
  if ((*(ustring->_M_dataplus)._M_p == '(') &&
     (removeOuterParenthesis(ustring), ustring->_M_string_length == 0)) {
    return true;
  }
  bVar29 = bVar7;
  if ((match_flags >> 0x24 & 1) == 0) {
    local_570[0].first._M_dataplus._M_p = (pointer)0x0;
    bVar41 = ReplaceStringInPlace(ustring,"**",2,"^",(int)local_570,in_R9);
    bVar29 = true;
    if (!bVar41) {
      bVar29 = bVar7;
    }
  }
  local_598 = (uint)match_flags;
  if ((local_598 >> 9 & 1) != 0) {
    if ((ciConversion(std::__cxx11::string&)::ciConversions_abi_cxx11_ == '\0') &&
       (iVar9 = __cxa_guard_acquire(&ciConversion(std::__cxx11::string&)::ciConversions_abi_cxx11_),
       iVar9 != 0)) {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
                (local_570,(char (*) [2])0x19f8ed,(char (*) [2])0x193677);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
                (local_570 + 1,(char (*) [2])0x19f8f0,(char (*) [2])0x19c383);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
                (local_570 + 2,(char (*) [2])0x1a0612,(char (*) [2])0x1934ec);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (local_570 + 3,(char (*) [3])"MM",(char (*) [3])0x19eb69);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_470,(char (*) [3])"NM",(char (*) [3])"nm");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_430,(char (*) [3])"ML",(char (*) [3])0x19a7d5);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_3f0,(char (*) [3])0x1a0801,(char (*) [3])"Gs");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[4],_true>
                (&local_3b0,(char (*) [3])"GL",(char (*) [4])"Gal");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_370,(char (*) [3])"MG",(char (*) [3])"mg");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[4],_const_char_(&)[4],_true>
                (&local_330,(char (*) [4])"[G]",(char (*) [4])"[g]");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_2f0,(char (*) [3])"PG",(char (*) [3])"pg");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_2b0,(char (*) [3])0x1a06c9,(char (*) [3])0x19b581);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_270,(char (*) [3])"UG",(char (*) [3])0x19e2be);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_230,(char (*) [3])0x19f6df,(char (*) [3])0x19dae1);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_1f0,(char (*) [3])0x19bf6c,(char (*) [3])0x19c032);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[4],_const_char_(&)[4],_true>
                (&local_1b0,(char (*) [4])"RAD",(char (*) [4])0x19b0fe);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[8],_true>
                (&local_170,(char (*) [3])"GB",(char (*) [8])"gilbert");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_130,(char (*) [3])"WB",(char (*) [3])"Wb");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_f0,(char (*) [3])"CP",(char (*) [3])"cP");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_b0,(char (*) [3])"EV",(char (*) [3])"eV");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[3],_const_char_(&)[3],_true>
                (&local_70,(char (*) [3])0x1a0ad1,(char (*) [3])"pT");
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_Hashtable<std::pair<std::__cxx11::string_const,std::__cxx11::string>const*>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)ciConversion(std::__cxx11::string&)::ciConversions_abi_cxx11_,local_570,
                 &stack0xffffffffffffffd0,0,&local_580,&local_581,&local_582);
      lVar33 = 0x500;
      do {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&local_570[0].first._M_dataplus._M_p + lVar33));
        lVar33 = lVar33 + -0x40;
      } while (lVar33 != -0x40);
      __cxa_atexit(std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::~unordered_map,ciConversion(std::__cxx11::string&)::ciConversions_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&ciConversion(std::__cxx11::string&)::ciConversions_abi_cxx11_);
      ustring = unit_string;
    }
    sVar4 = ustring->_M_string_length;
    if (sVar4 != 0) {
      pcVar19 = (ustring->_M_dataplus)._M_p;
      sVar39 = 0;
      do {
        iVar9 = toupper((int)pcVar19[sVar39]);
        pcVar19[sVar39] = (char)iVar9;
        sVar39 = sVar39 + 1;
      } while (sVar4 != sVar39);
    }
    cVar17 = std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)ciConversion(std::__cxx11::string&)::ciConversions_abi_cxx11_,ustring);
    if (cVar17.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      pcVar26 = (ustring->_M_dataplus)._M_p;
      cVar21 = *pcVar26;
      if (cVar21 == 'P') {
        cVar21 = 'p';
LAB_0018290e:
        *pcVar26 = cVar21;
      }
      else if (cVar21 == 'M') {
        cVar21 = 'm';
        goto LAB_0018290e;
      }
      pcVar26 = (ustring->_M_dataplus)._M_p;
      sVar4 = ustring->_M_string_length;
      if (pcVar26[sVar4 - 1] == 'M') {
        if (sVar4 == 3) {
          dVar44 = getPrefixMultiplier2Char(*pcVar26,pcVar26[1]);
        }
        else {
          if (sVar4 != 2) goto LAB_00182964;
          dVar44 = getPrefixMultiplier(*pcVar26);
        }
        if ((dVar44 != 0.0) || (NAN(dVar44))) {
          pcVar26[sVar4 - 1] = 'm';
        }
      }
    }
    else {
      std::__cxx11::string::_M_assign((string *)ustring);
    }
LAB_00182964:
    lVar33 = std::__cxx11::string::find((char *)ustring,0x19f8ec,0);
    if (lVar33 != -1) {
      (ustring->_M_dataplus)._M_p[lVar33 + 1] = 's';
    }
    lVar33 = std::__cxx11::string::find((char *)ustring,0x19f8ef,0);
    bVar29 = true;
    if (lVar33 != -1) {
      (ustring->_M_dataplus)._M_p[lVar33 + 1] = 'g';
    }
  }
  if ((match_flags >> 0x24 & 1) == 0) {
    lVar33 = std::__cxx11::string::rfind((char)ustring,0x3c);
    if (lVar33 != -1) {
      uVar11 = std::__cxx11::string::find((char *)ustring,0x19f8f2,0);
      do {
        if (uVar11 == 0xffffffffffffffff) {
          uVar11 = std::__cxx11::string::find((char *)ustring,0x19f907,0);
          do {
            if (uVar11 == 0xffffffffffffffff) goto LAB_00182b66;
            std::__cxx11::string::replace((ulong)ustring,uVar11,(char *)0x5,0x1a0529);
            uVar11 = std::__cxx11::string::find((char *)ustring,0x19f90d,0);
            if (uVar11 == 0xffffffffffffffff) {
              uVar11 = std::__cxx11::string::find((char *)ustring,0x19f914,0);
              if (uVar11 != 0xffffffffffffffff) {
                pcVar26 = (char *)0x8;
                goto LAB_00182b3d;
              }
            }
            else {
              pcVar26 = (char *)0x6;
LAB_00182b3d:
              std::__cxx11::string::replace((ulong)ustring,uVar11,pcVar26,0x19a42d);
            }
            uVar11 = std::__cxx11::string::find((char *)ustring,0x19f907,0);
          } while( true );
        }
        std::__cxx11::string::replace((ulong)ustring,uVar11,(char *)0x5,0x19f91f);
        uVar11 = std::__cxx11::string::find((char *)ustring,0x19f8f8,0);
        if (uVar11 == 0xffffffffffffffff) {
          uVar11 = std::__cxx11::string::find((char *)ustring,0x19f8ff,0);
          if (uVar11 != 0xffffffffffffffff) {
            pcVar26 = (char *)0x8;
            goto LAB_00182a7c;
          }
        }
        else {
          pcVar26 = (char *)0x6;
LAB_00182a7c:
          std::__cxx11::string::replace((ulong)ustring,uVar11,pcVar26,0x19a42d);
        }
        uVar11 = std::__cxx11::string::find((char *)ustring,0x19f8f2,0);
      } while( true );
    }
LAB_00182b66:
    lVar33 = 0;
    do {
      pcVar26 = *(char **)((long)&cleanUnitString::allCodeReplacements._M_elems[0].first + lVar33);
      strlen(pcVar26);
      uVar11 = std::__cxx11::string::find((char *)unit_string,(ulong)pcVar26,0);
      if (uVar11 != 0xffffffffffffffff) {
        pcVar23 = *(char **)((long)&cleanUnitString::allCodeReplacements._M_elems[0].second + lVar33
                            );
        do {
          pcVar30 = (char *)strlen(pcVar26);
          strlen(pcVar23);
          std::__cxx11::string::replace((ulong)unit_string,uVar11,pcVar30,(ulong)pcVar23);
          strlen(pcVar26);
          uVar11 = std::__cxx11::string::find((char *)unit_string,(ulong)pcVar26,uVar11 + 1);
        } while (uVar11 != 0xffffffffffffffff);
        bVar29 = true;
      }
      lVar33 = lVar33 + 0x10;
    } while (lVar33 != 0x250);
  }
  uVar11 = unit_string->_M_string_length;
  if ((1 < uVar11) &&
     (pcVar19 = (unit_string->_M_dataplus)._M_p, (pcVar19[uVar11 - 1] & 0xfeU) == 0x32)) {
    pcVar26 = pcVar19 + (uVar11 - 1);
    if (((pcVar19[uVar11 - 2] == '-') || (pcVar19[uVar11 - 2] == '+')) && (uVar11 != 2)) {
      pcVar26 = pcVar19 + (uVar11 - 2);
    }
    if (9 < (byte)(pcVar26[-1] - 0x30U)) {
      uVar8 = (byte)pcVar26[-1] - 0x2a;
      if (uVar8 < 0x3c) {
        if ((0x81000000800003aU >> ((ulong)uVar8 & 0x3f) & 1) == 0) {
          if ((ulong)uVar8 != 0) goto LAB_00183556;
          pcVar26[-1] = '^';
        }
      }
      else {
LAB_00183556:
        if (*pcVar26 == '+') {
          *pcVar26 = '^';
        }
        else {
          std::__cxx11::string::_M_replace_aux
                    ((ulong)unit_string,(long)pcVar26 - (long)pcVar19,0,'\x01');
        }
      }
    }
  }
  if ((match_flags >> 0x24 & 1) == 0) {
    lVar33 = std::__cxx11::string::rfind(cVar32,0x2e);
    if ((lVar33 != -1) && (9 < (byte)((unit_string->_M_dataplus)._M_p[lVar33 + 1] - 0x30U))) {
      iVar9 = 0;
      lVar33 = std::__cxx11::string::find(cVar32,0x2e);
      if (lVar33 == -1) {
        bVar7 = false;
      }
      else {
        cVar28 = '\0';
        cVar21 = '\0';
        while (lVar33 == 0) {
          if ((1 < unit_string->_M_string_length) &&
             (cVar21 = cVar28, 9 < (byte)((unit_string->_M_dataplus)._M_p[1] - 0x30U))) {
            cVar28 = '\x01';
            cVar21 = '\x01';
          }
LAB_00182d50:
          lVar33 = std::__cxx11::string::find(cVar32,0x2e);
        }
        cVar22 = cVar21;
        if (lVar33 != -1) {
          pcVar19 = (unit_string->_M_dataplus)._M_p;
          if (((byte)(pcVar19[lVar33 + -1] - 0x30U) < 10) &&
             ((byte)(pcVar19[lVar33 + 1] - 0x30U) < 10)) goto LAB_00182d50;
          cVar22 = '\x02';
          if ((pcVar19[lVar33 + -1] != '*') && (pcVar19[lVar33 + 1] != ' ')) {
            cVar28 = '\x01';
            cVar21 = '\x01';
            if (lVar33 != unit_string->_M_string_length - 1) goto LAB_00182d50;
          }
        }
        bVar7 = cVar22 == '\x01';
      }
      while( true ) {
        while (uVar11 = std::__cxx11::string::find(cVar32,0x2e), uVar11 == 0) {
          if (1 < unit_string->_M_string_length) {
            pcVar19 = (unit_string->_M_dataplus)._M_p;
            if ((byte)(pcVar19[1] - 0x30U) < 10) {
              iVar9 = iVar9 + 1;
            }
            else if (bVar7) {
              *pcVar19 = '*';
            }
            else {
              while ((cVar21 = *(unit_string->_M_dataplus)._M_p, cVar21 == '.' || (cVar21 == ' ')))
              {
                std::__cxx11::string::erase((ulong)unit_string,0);
              }
            }
          }
        }
        if (uVar11 == 0xffffffffffffffff) break;
        pcVar19 = (unit_string->_M_dataplus)._M_p;
        if ((((byte)(pcVar19[uVar11 - 1] - 0x30U) < 10) &&
            ((byte)(pcVar19[uVar11 + 1] - 0x30U) < 10)) || (pcVar19[uVar11 - 1] == '*')) {
          iVar9 = iVar9 + 1;
        }
        else if (bVar7) {
          pcVar19[uVar11] = '*';
        }
        else {
          while ((cVar21 = (unit_string->_M_dataplus)._M_p[uVar11], cVar21 == '.' || (cVar21 == ' ')
                 )) {
            std::__cxx11::string::erase((ulong)unit_string,uVar11);
          }
        }
      }
      if (1 < iVar9) {
        iVar9 = 0;
        lVar33 = std::__cxx11::string::find(cVar32,0x2e);
        if (lVar33 != -1) {
          iVar9 = 0;
          do {
            lVar27 = lVar33;
            do {
              lVar27 = lVar27 + 1;
              cVar21 = (unit_string->_M_dataplus)._M_p[lVar27];
              if (cVar21 == '.') goto LAB_00182eb0;
            } while ((byte)(cVar21 - 0x30U) < 10);
            lVar33 = std::__cxx11::string::find(cVar32,0x2e);
LAB_00182eb0:
            pcVar19 = (unit_string->_M_dataplus)._M_p;
            if (pcVar19[lVar27] == '.') {
              pcVar19[lVar27] = '*';
              lVar33 = std::__cxx11::string::find(cVar32,0x2e);
            }
            else {
              iVar9 = iVar9 + 1;
            }
          } while (lVar33 != -1);
        }
      }
      if (0 < iVar9) {
LAB_00182ef0:
        lVar33 = std::__cxx11::string::find(cVar32,0x2e);
        if (lVar33 != -1) {
          pcVar19 = (unit_string->_M_dataplus)._M_p;
          lVar27 = lVar33;
          do {
            lVar27 = lVar27 + -1;
            if (lVar27 == 0) goto LAB_00182ef0;
            bVar35 = pcVar19[lVar27];
          } while ((byte)(bVar35 - 0x30) < 10);
          if ((bVar35 | 0x20) == 0x65) {
            pcVar19[lVar33] = '*';
          }
          goto LAB_00182ef0;
        }
      }
      bVar29 = true;
      if (((local_598 >> 10 & 1) != 0) &&
         (lVar33 = std::__cxx11::string::rfind(cVar32,0x2f), lVar33 != -1)) {
        std::__cxx11::string::insert((ulong)unit_string,lVar33 + 1,'\x01');
        std::__cxx11::string::push_back(cVar32);
      }
    }
    for (uVar11 = std::__cxx11::string::find((char *)unit_string,0x19aacf,0);
        uVar11 != 0xffffffffffffffff;
        uVar11 = std::__cxx11::string::find((char *)unit_string,0x19aacf,uVar11)) {
      if ((uVar11 + 2 < unit_string->_M_string_length) &&
         ((unit_string->_M_dataplus)._M_p[uVar11 + 2] == '^')) {
        std::__cxx11::string::replace((ulong)unit_string,uVar11,(char *)0x2,0x19f74a);
      }
      else {
        std::__cxx11::string::erase((ulong)unit_string,uVar11);
      }
    }
    clearEmptySegments(unit_string);
    sVar18 = std::__cxx11::string::find((char *)unit_string,0x19f91c,0);
    do {
      if (sVar18 == 0xffffffffffffffff) break;
      pcVar19 = (unit_string->_M_dataplus)._M_p;
      cVar21 = pcVar19[sVar18 + 4];
      if ((cVar21 == '-') || (cVar21 == '+')) {
        if (sVar18 + 5 < unit_string->_M_string_length) {
          cVar21 = pcVar19[sVar18 + 5];
          sz = 5;
          goto LAB_0018307e;
        }
        multiplyRep(unit_string,sVar18,5);
        bVar7 = false;
      }
      else {
        sz = 4;
LAB_0018307e:
        if ((byte)(cVar21 - 0x30U) < 10) {
          do {
            sz = sz + 1;
            if (unit_string->_M_string_length <= sz + sVar18) break;
          } while ((byte)(pcVar19[sz + sVar18] - 0x30U) < 10);
        }
        multiplyRep(unit_string,sVar18,sz);
        sVar18 = std::__cxx11::string::find((char *)unit_string,0x19f91c,sVar18);
        bVar7 = true;
      }
    } while (bVar7);
    uVar11 = std::__cxx11::string::find((char *)unit_string,0x19f921,0);
    while (uVar11 != 0xffffffffffffffff) {
      uVar13 = uVar11 + 2;
      if ((unit_string->_M_string_length <= uVar13) ||
         (9 < (byte)((unit_string->_M_dataplus)._M_p[uVar13] - 0x30U))) {
        std::__cxx11::string::erase((ulong)unit_string,uVar11);
        uVar13 = uVar11;
      }
      uVar11 = std::__cxx11::string::find((char *)unit_string,0x19f921,uVar13);
    }
    for (sVar18 = std::__cxx11::string::find((char *)unit_string,0x19f924,0);
        sVar18 != 0xffffffffffffffff;
        sVar18 = std::__cxx11::string::find((char *)unit_string,0x19f924,sVar18)) {
      multiplyRep(unit_string,sVar18,4);
    }
    if (unit_string->_M_string_length == 0) {
      std::__cxx11::string::push_back(cVar32);
      return true;
    }
  }
  while ((unit_string->_M_string_length != 0 &&
         (((bVar35 = *(unit_string->_M_dataplus)._M_p, bVar35 - 0x29 < 2 || (bVar35 == 0x7d)) ||
          (bVar35 == 0x5d))))) {
    std::__cxx11::string::erase((ulong)unit_string,0);
    if (unit_string->_M_string_length == 0) {
      return true;
    }
    if (*(unit_string->_M_dataplus)._M_p == '(') {
      removeOuterParenthesis(unit_string);
    }
    bVar29 = true;
  }
  uVar13 = std::__cxx11::string::find_first_of((char *)unit_string,0x19f74d,0);
  uVar11 = unit_string->_M_string_length;
  if (uVar13 < uVar11 - 1) {
    do {
      if (local_590 <= uVar13) break;
      uVar14 = uVar13 + 1;
      pcVar19 = (unit_string->_M_dataplus)._M_p;
      bVar35 = pcVar19[uVar13 + 1];
      uVar8 = (uint)bVar35;
      if (bVar35 < 0x6f) {
        if ((0x35 < uVar8 - 0x29) ||
           ((0x30000000200043U >> ((ulong)(uVar8 - 0x29) & 0x3f) & 1) == 0)) goto LAB_00183328;
LAB_0018327e:
        uVar13 = std::__cxx11::string::find_first_of((char *)unit_string,0x19f74d,uVar14);
      }
      else {
        if (bVar35 == 0x7d) goto LAB_0018327e;
        if (uVar8 == 0x7b) {
          if (pcVar19[uVar13] == '}') goto LAB_00183328;
          goto LAB_0018327e;
        }
        if (uVar8 != 0x6f) {
LAB_00183328:
          if (pcVar19[uVar13 - 1] != '\\') {
            std::__cxx11::string::insert((ulong)unit_string,uVar14,'\x01');
            uVar14 = uVar13 + 2;
          }
          goto LAB_0018327e;
        }
        uVar14 = uVar13 + 3;
        if (uVar11 <= uVar14) {
LAB_00183300:
          std::__cxx11::string::insert((ulong)unit_string,uVar13 + 1,'\x01');
          uVar14 = uVar13 + 3;
          goto LAB_0018327e;
        }
        bVar7 = true;
        if (((pcVar19[uVar13 + 2] == 'f') && (cVar21 = pcVar19[uVar14], cVar21 != ')')) &&
           ((cVar21 != ']' && (cVar21 != '}')))) {
          uVar13 = std::__cxx11::string::find_first_of((char *)unit_string,0x19f74d,uVar14);
          bVar7 = false;
        }
        if (bVar7) goto LAB_00183300;
      }
      uVar11 = unit_string->_M_string_length;
    } while (uVar13 < uVar11 - 1);
  }
  uVar13 = std::__cxx11::string::find(cVar32,0x5e);
  sVar4 = unit_string->_M_string_length;
  uVar11 = sVar4 - 3;
  if (uVar13 < uVar11) {
    while (uVar13 < local_590) {
      pcVar19 = (unit_string->_M_dataplus)._M_p;
      uVar14 = uVar13 + 1;
      if (pcVar19[uVar13 + 1] != '-') {
        uVar14 = uVar13;
      }
      if (uVar14 < uVar11) {
        uVar11 = 1;
        if ((byte)(pcVar19[uVar14 + 1] - 0x30U) < 10) {
          lVar33 = 0;
          do {
            if (sVar4 - 1 < uVar14 + 1 + lVar33) break;
            lVar27 = lVar33 + uVar14 + 2;
            lVar33 = lVar33 + 1;
          } while ((byte)(pcVar19[lVar27] - 0x30U) < 10);
          uVar11 = lVar33 + 1;
        }
        uVar14 = uVar11 + uVar14;
        if (1 < uVar11 && uVar14 <= sVar4 - 1) {
          uVar8 = (byte)pcVar19[uVar14] - 0x2a;
          if (((0x3b < uVar8) || ((0x810000008000021U >> ((ulong)uVar8 & 0x3f) & 1) == 0)) &&
             (pcVar19[uVar14] != 0)) {
            std::__cxx11::string::insert((ulong)unit_string,uVar14,'\x01');
          }
        }
        if (sVar4 - 1 < uVar14) break;
      }
      uVar13 = std::__cxx11::string::find(cVar32,0x5e);
      sVar4 = unit_string->_M_string_length;
      uVar11 = sVar4 - 3;
      if (uVar11 <= uVar13) break;
    }
  }
  if ((unit_string->_M_string_length != 0) && (*(unit_string->_M_dataplus)._M_p == '/')) {
    std::__cxx11::string::_M_replace_aux((ulong)unit_string,0,0,'\x01');
    bVar29 = true;
  }
  if (((match_flags >> 0x24 & 1) == 0) &&
     (pcVar19 = (pointer)std::__cxx11::string::find(cVar32,0x7b),
     pcVar19 != (pointer)0xffffffffffffffff)) {
    do {
      local_570[0].first._M_dataplus._M_p = pcVar19 + 1;
      bVar7 = segmentcheck(unit_string,'}',(size_t *)local_570);
      pcVar20 = (pointer)0xffffffffffffffff;
      if (bVar7) {
        pcVar20 = (unit_string->_M_dataplus)._M_p;
        if (pcVar19 + (long)(pcVar20 + 1) !=
            local_570[0].first._M_dataplus._M_p + (long)(pcVar20 + -1)) {
          pcVar34 = local_570[0].first._M_dataplus._M_p + -2;
          do {
            iVar9 = tolower((int)pcVar19[(long)(pcVar20 + 1)]);
            pcVar19[(long)(pcVar20 + 1)] = (char)iVar9;
            pcVar19 = pcVar19 + 1;
          } while (pcVar34 != pcVar19);
        }
        pcVar20 = (pointer)std::__cxx11::string::find(cVar32,0x7b);
      }
      pcVar19 = pcVar20;
    } while (pcVar20 != (pointer)0xffffffffffffffff);
  }
  if (!bVar29) {
    return unit_string->_M_string_length != local_578;
  }
  return true;
LAB_0018255d:
  if (iVar9 != 0) {
LAB_001825aa:
    if (unit_string->_M_string_length == 0) {
      return true;
    }
    bVar7 = (bool)(bVar29 | bVar36);
    goto LAB_001825c6;
  }
LAB_00182562:
  bVar7 = local_5a9;
  if ((ustring == (string *)0x0) ||
     (bVar7 = true, ((unit_string->_M_dataplus)._M_p + -1)[(long)ustring] != '.')) {
    std::__cxx11::string::erase((ulong)unit_string,(ulong)ustring);
    bVar35 = 1;
    local_5a9 = bVar7;
  }
  else {
    ustring = (string *)((long)&(ustring->_M_dataplus)._M_p + 1);
    bVar35 = 1;
  }
  goto LAB_001820b7;
}

Assistant:

static bool cleanUnitString(std::string& unit_string, std::uint64_t match_flags)
{
    auto slen = unit_string.size();
    bool skipcodereplacement = ((match_flags & skip_code_replacements) != 0);
    static UNITS_CPP14_CONSTEXPR_OBJECT std::array<ckpair, 4>
        earlyCodeReplacements{{
            ckpair{"degree", "deg"},
            ckpair{"Degree", "deg"},
            ckpair{"degs ", "deg"},
            ckpair{"deg ", "deg"},
        }};

    static UNITS_CPP14_CONSTEXPR_OBJECT std::array<ckpair, 37>
        allCodeReplacements{{
            ckpair{"sq.", "square"},
            ckpair{"cu.", "cubic"},
            ckpair{"U.S.A.", "US"},
            ckpair{"U.S.", "US"},
            ckpair{"10^", "1e"},
            ckpair{"10-", "1e-"},
            ckpair{"^+", "^"},
            ckpair{"'s", "s"},
            ckpair{"ampere", "amp"},
            ckpair{"Ampere", "amp"},
            ckpair{"metre", "meter"},
            ckpair{"Metre", "meter"},
            ckpair{"litre", "liter"},
            ckpair{"Litre", "liter"},
            ckpair{"B.Th.U.", "BTU"},
            ckpair{"B.T.U.", "BTU"},
            ckpair{"Britishthermalunits", "BTU"},
            ckpair{"Britishthermalunitat", "BTU"},
            ckpair{"Britishthermalunit", "BTU"},
            ckpair{"BritishThermalUnits", "BTU"},
            ckpair{"BritishThermalUnitAt", "BTU"},
            ckpair{"BritishThermalUnit", "BTU"},
            ckpair{"BThU", "BTU"},
            ckpair{"-US", "US"},
            ckpair{"--", "*"},
            // -- is either a double negative or a separator, so make it a
            // multiplier so it doesn't get erased and then converted to a
            // power
            ckpair{"\\\\", "\\\\*"},
            // \\ is always considered a segment terminator so it won't be
            // misinterpreted as a known escape sequence
            ckpair{"perunit", "pu"},
            ckpair{"percent", "%"},
            ckpair{"per-unit", "pu"},
            ckpair{"per unit ", "pu"},
            ckpair{"/square*", "/square"},
            ckpair{"/cubic*", "/cubic"},
            ckpair{"Hz^0.5", "rootHertz"},
            ckpair{"Hz^.5", "rootHertz"},
            ckpair{"Hz^(1/2)", "rootHertz"},
            ckpair{"Hz^1/2", "rootHertz"},
            ckpair{u8"\u221AHz", "rootHertz"},
        }};

    static const std::string spchar = std::string(" \t\n\r") + '\0';
    bool changed = false;
    bool skipMultiply = false;
    std::size_t skipMultiplyInsertionAfter{std::string::npos};
    char tail = unit_string.back();
    if (tail == '^' || tail == '*' || tail == '/') {
        unit_string.pop_back();
        changed = true;
    }
    auto c = unit_string.find_first_not_of(spchar);
    if (c == std::string::npos) {
        unit_string.clear();
        return true;
    }
    if (c != 0) {
        unit_string.erase(0, c);
        c = unit_string.find_first_not_of(spchar);
        changed = true;
    }
    if (unit_string[c] == '/') {
        unit_string.insert(c, 1, '1');
        changed = true;
        skipMultiply = true;
    }
    if (!skipcodereplacement) {
        // Check for unicode or extended characters
        if (std::any_of(unit_string.begin(), unit_string.end(), [](char x) {
                return (static_cast<std::uint8_t>(x) & 0x80U) != 0;
            })) {
            if (unicodeReplacement(unit_string)) {
                changed = true;
            }
        }

        // some code replacement that needs to be done before single character
        // and space replacements
        for (const auto& acode : earlyCodeReplacements) {
            auto fnd = unit_string.find(acode.first);
            while (fnd != std::string::npos) {
                changed = true;
                unit_string.replace(fnd, strlen(acode.first), acode.second);
                fnd = unit_string.find(acode.first, fnd + 1);
            }
        }

        if (unit_string.find_first_of(spchar) != std::string::npos) {
            // deal with some particular string with a space in them
            std::size_t reploc{0};
            // clean up some "per" words
            if (unit_string.compare(0, 4, "per ") == 0) {
                reploc = 2;
                unit_string.replace(0, 4, "1/");
                skipMultiply = true;
            }
            if (ReplaceStringInPlace(unit_string, " per ", 5, "/", 1, reploc)) {
                skipMultiply = true;
            }
            if (reploc > 0) {
                auto ploc = unit_string.find_first_of('(', reploc);
                if (ploc != std::string::npos) {
                    auto fdiv = unit_string.find_first_of('/', reploc);
                    std::size_t ndiv{0};
                    do {
                        ndiv = unit_string.find_first_of('/', fdiv + 1);
                        if (ploc < ndiv) {
                            if (ndiv != std::string::npos) {
                                unit_string.insert(ndiv, 1, ')');
                            } else {
                                unit_string.push_back(')');
                            }
                            unit_string.insert(fdiv + 1, 1, '(');
                            fdiv = ndiv + 2;
                        } else {
                            fdiv = ndiv;
                        }
                    } while (ndiv != std::string::npos);
                }
            }
            checkShortUnits(unit_string, match_flags);
            auto fndP = unit_string.find(" of ");
            while (fndP != std::string::npos) {
                auto nchar = unit_string.find_first_not_of(spchar, fndP + 4);
                if (nchar != std::string::npos) {
                    if (unit_string[nchar] == '(' ||
                        unit_string[nchar] == '[') {
                        skipMultiplyInsertionAfter = fndP;
                        break;
                    }
                }
                fndP = unit_string.find(" of ", fndP + 3);
            }
            changed |= cleanSpaces(unit_string, skipMultiply);
            if (unit_string.empty()) {
                // LCOV_EXCL_START
                return true;
                // LCOV_EXCL_STOP
            }
        }

        checkPowerOf10(unit_string);
    } else {
        auto fndP = unit_string.find("of(");
        if (fndP != std::string::npos) {
            skipMultiplyInsertionAfter = fndP;
        }
    }
    if (unit_string.front() == '(') {
        removeOuterParenthesis(unit_string);
        if (unit_string.empty()) {
            return true;
        }
    }

    if (!skipcodereplacement) {
        // ** means power in some environments
        std::size_t loc{0};
        if (ReplaceStringInPlace(unit_string, "**", 2, "^", 1, loc)) {
            changed = true;
        }
    }
    if ((match_flags & case_insensitive) != 0) {
        ciConversion(unit_string);
        changed = true;
    }
    if (!skipcodereplacement) {
        // deal with some html stuff
        auto bloc = unit_string.find_last_of('<');
        if (bloc != std::string::npos) {
            htmlCodeReplacement(unit_string);
        }
        // some abbreviations and other problematic code replacements
        for (const auto& acode : allCodeReplacements) {
            auto fnd = unit_string.find(acode.first);
            while (fnd != std::string::npos) {
                changed = true;
                unit_string.replace(fnd, strlen(acode.first), acode.second);
                fnd = unit_string.find(acode.first, fnd + 1);
            }
        }
    }
    if (unit_string.size() >= 2) {
        auto eit = unit_string.end() - 1;
        if (*(eit) == '2' || *(eit) == '3') {
            if ((*(eit - 1) == '-' || *(eit - 1) == '+') &&
                unit_string.size() >= 3) {
                --eit;
            }
            if (!isDigitCharacter(*(eit - 1))) {
                switch (*(eit - 1)) {
                    case '^':
                    case 'e':
                    case 'E':
                    case '/':
                    case '+':
                    case '-':
                    case '.':
                        break;
                    case '*':
                        *(eit - 1) = '^';
                        break;
                    default:
                        if (eit[0] != '+') {
                            unit_string.insert(eit, '^');
                        } else {
                            *eit = '^';
                        }

                        break;
                }
            }
        }
    }
    if (!skipcodereplacement) {
        // handle dot notation for multiplication
        auto dotloc = unit_string.find_last_of('.');
        if (dotloc < std::string::npos) {
            // strings always have a null pointer at the end
            if (!isDigitCharacter(unit_string[dotloc + 1])) {
                cleanDotNotation(unit_string, match_flags);
                changed = true;
            }
        }

        // clear empty parenthesis
        auto fndP = unit_string.find("()");
        while (fndP != std::string::npos) {
            if (unit_string.size() > fndP + 2) {
                if (unit_string[fndP + 2] == '^') {
                    unit_string.replace(fndP, 2, "*1");
                } else {
                    unit_string.erase(fndP, 2);
                }
            } else {
                unit_string.erase(fndP, 2);
            }
            fndP = unit_string.find("()", fndP);
        }
        // clear empty brackets, this would indicate commodities but if
        // empty there is no commodity
        clearEmptySegments(unit_string);
        cleanUpPowersOfOne(unit_string);
        if (unit_string.empty()) {
            unit_string.push_back('1');
            return true;
        }
    }
    // remove leading *})],  equivalent of 1* but we don't need to process
    // that further
    while (!unit_string.empty() &&
           (unit_string.front() == '*' || unit_string.front() == '}' ||
            unit_string.front() == ')' || unit_string.front() == ']')) {
        unit_string.erase(0, 1);
        changed = true;
        if (unit_string.empty()) {
            return true;
        }
        // check for parenthesis again
        if (unit_string.front() == '(') {
            removeOuterParenthesis(unit_string);
        }
    }
    // inject multiplies after bracket terminators
    auto fnd = unit_string.find_first_of(")]}");
    while (fnd < unit_string.size() - 1 && fnd < skipMultiplyInsertionAfter) {
        switch (unit_string[fnd + 1]) {
            case '^':
            case '*':
            case '/':
            case ')':
            case ']':
            case '}':
            case '>':
                fnd = unit_string.find_first_of(")]}", fnd + 1);
                break;
            case 'o':  // handle special case of commodity modifier using
                       // "of"
                if (unit_string.size() > fnd + 3) {
                    auto tc2 = unit_string[fnd + 3];
                    if (unit_string[fnd + 2] == 'f' && tc2 != ')' &&
                        tc2 != ']' && tc2 != '}') {
                        fnd = unit_string.find_first_of(")]}", fnd + 3);
                        break;
                    }
                }
                unit_string.insert(fnd + 1, 1, '*');
                fnd = unit_string.find_first_of(")]}", fnd + 3);
                break;
            case '{':
                if (unit_string[fnd] != '}') {
                    fnd = unit_string.find_first_of(")]}", fnd + 1);
                    break;
                }
                /* FALLTHRU */
            default:
                if (unit_string[fnd - 1] == '\\') {  // ignore escape sequences
                    fnd = unit_string.find_first_of(")]}", fnd + 1);
                    break;
                }
                unit_string.insert(fnd + 1, 1, '*');
                fnd = unit_string.find_first_of(")]}", fnd + 2);
                break;
        }
    }
    // insert multiplies after ^#
    fnd = unit_string.find_first_of('^');
    while (fnd < unit_string.size() - 3 && fnd < skipMultiplyInsertionAfter) {
        if (unit_string[fnd + 1] == '-') {
            ++fnd;
        }
        if (fnd < unit_string.size() - 3) {
            std::size_t seq = 1;
            auto p = unit_string[fnd + seq];
            while (p >= '0' && p <= '9' &&
                   fnd + seq <= unit_string.size() - 1U) {
                ++seq;
                p = unit_string[fnd + seq];
            }
            if (fnd + seq > unit_string.size() - 1U) {
                break;
            }
            if (seq > 1) {
                auto c2 = unit_string[fnd + seq];
                if (c2 != '\0' && c2 != '*' && c2 != '/' && c2 != '^' &&
                    c2 != 'e' && c2 != 'E') {
                    unit_string.insert(fnd + seq, 1, '*');
                }
            }
        }
        fnd = unit_string.find_first_of('^', fnd + 2);
    }

    // this still might occur from code replacements or other removal
    if (!unit_string.empty() && unit_string.front() == '/') {
        unit_string.insert(unit_string.begin(), '1');
        changed = true;
    }
    if (!skipcodereplacement) {  // make everything inside {} lower case
        auto bloc = unit_string.find_first_of('{');
        while (bloc != std::string::npos) {
            auto ind = bloc + 1;
            if (segmentcheck(unit_string, '}', ind)) {
                std::transform(
                    unit_string.begin() + bloc + 1,
                    unit_string.begin() + ind - 1,
                    unit_string.begin() + bloc + 1,
                    ::tolower);
                bloc = unit_string.find_first_of('{', ind);
            } else {
                bloc = std::string::npos;
            }
        }
    }
    return (changed || unit_string.size() != slen);
}